

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O3

vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
* __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::
export_filter<boost::asio::ip::address_v4>
          (vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
           *__return_storage_ptr__,filter_impl<std::array<unsigned_char,_4UL>_> *this)

{
  uint uVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  _Rb_tree_color local_30;
  value_type local_2c;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  ::reserve(__return_storage_ptr__,
            (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var2 = (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    do {
      local_2c.last.addr_.s_addr = (in4_addr_type)0;
      local_2c.first.addr_.s_addr = (in4_addr_type)p_Var2[1]._M_color;
      local_2c.flags = *(uint32_t *)&p_Var2[1].field_0x4;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
      if ((_Rb_tree_header *)p_Var2 == p_Var4) {
        local_2c.last.addr_.s_addr = (in4_addr_type)(in4_addr_type)~_S_red;
      }
      else {
        local_30 = p_Var2[1]._M_color;
        uVar1 = 3;
        do {
          uVar3 = (ulong)uVar1;
          if (*(char *)((long)&local_30 + uVar3) != '\0') {
            *(char *)((long)&local_30 + uVar3) = *(char *)((long)&local_30 + uVar3) + -1;
            local_2c.last.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_30;
            break;
          }
          *(undefined1 *)((long)&local_30 + uVar3) = 0xff;
          bVar5 = uVar1 != 0;
          uVar1 = uVar1 - 1;
          local_2c.last.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_30;
        } while (bVar5);
      }
      ::std::
      vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
      ::push_back(__return_storage_ptr__,&local_2c);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ip_range<ExternalAddressType>> filter_impl<Addr>::export_filter() const
	{
		std::vector<ip_range<ExternalAddressType>> ret;
		ret.reserve(m_access_list.size());

		for (auto i = m_access_list.begin()
			, end(m_access_list.end()); i != end;)
		{
			ip_range<ExternalAddressType> r;
			r.first = ExternalAddressType(i->start);
			r.flags = i->access;

			++i;
			if (i == end)
				r.last = ExternalAddressType(max_addr<Addr>());
			else
				r.last = ExternalAddressType(minus_one(i->start));

			ret.push_back(r);
		}
		return ret;
	}